

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr_time.c
# Opt level: O1

void chr_timer_stop(chr_time *time)

{
  double dVar1;
  double dVar2;
  timeval *s2;
  timeval now;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  dVar1 = (double)(local_20.tv_usec - (long)time->d2);
  dVar2 = (double)((long)dVar1 + 1000000);
  if (-1 < (long)dVar1) {
    dVar2 = dVar1;
  }
  time->d1 = (double)(((long)dVar1 >> 0x3f) + (local_20.tv_sec - (long)time->d1));
  time->d2 = dVar2;
  return;
}

Assistant:

extern void
chr_timer_stop( chr_time *time)
{
    struct timeval now;
    struct timeval duration;

#ifndef HAVE_WINDOWS_H
    gettimeofday((struct timeval*)&now, NULL);
#else
    /* GSE...  No gettimeofday on windows.
     * Must use _ftime, get millisec time, convert to usec.  Bleh.
     */
    struct _timeb nowb;
    _ftime(&nowb);
    ((struct timeval*)&now)->tv_sec = (long)nowb.time;
    ((struct timeval*)&now)->tv_usec = nowb.millitm * 1000;
#endif
//    gettimeofday(&now, NULL);
    chr_timer_diff((chr_time*)&duration, (chr_time*)&now, time);
    *((struct timeval *) time) = duration;
}